

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *w)

{
  uint *puVar1;
  pointer pnVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  long lVar10;
  uint uVar11;
  int iVar12;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  ulong uVar9;
  ulong uVar13;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  iVar12 = (w->super_IdxSet).num;
  if (0 < iVar12 && 0 < *(int *)(this + 8)) {
    uVar11 = iVar12 - 1;
    uVar13 = (ulong)uVar11;
    uVar7 = *(int *)(this + 8) - 1;
    uVar9 = (ulong)uVar7;
    lVar4 = *(long *)(this + 0x10);
    iVar3 = *(int *)(lVar4 + uVar9 * 4);
    piVar6 = (w->super_IdxSet).idx;
    iVar12 = piVar6[uVar13];
    if (uVar11 != 0 && uVar7 != 0) {
      do {
        iVar8 = (int)uVar9;
        if (iVar3 == iVar12) {
          lVar4 = (long)iVar12;
          puVar5 = (uint *)(*(long *)(this + 0x20) + lVar4 * 0x38);
          pnVar2 = (w->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_a8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 0x20);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar4].m_backend.data;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar2[lVar4].m_backend.data + 0x10);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_a8.exp = pnVar2[lVar4].m_backend.exp;
          local_a8.neg = pnVar2[lVar4].m_backend.neg;
          local_a8.fpclass = pnVar2[lVar4].m_backend.fpclass;
          local_a8.prec_elem = pnVar2[lVar4].m_backend.prec_elem;
          local_e8.fpclass = cpp_dec_float_finite;
          local_e8.prec_elem = 10;
          local_e8.data._M_elems[0] = 0;
          local_e8.data._M_elems[1] = 0;
          local_e8.data._M_elems[2] = 0;
          local_e8.data._M_elems[3] = 0;
          local_e8.data._M_elems[4] = 0;
          local_e8.data._M_elems[5] = 0;
          local_e8.data._M_elems._24_5_ = 0;
          local_e8.data._M_elems[7]._1_3_ = 0;
          local_e8.data._M_elems._32_5_ = 0;
          local_e8.data._M_elems[9]._1_3_ = 0;
          local_e8.exp = 0;
          local_e8.neg = false;
          if (&local_e8 != (cpp_dec_float<50U,_int,_void> *)puVar5) {
            local_e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar5 + 8),0);
            local_e8.data._M_elems[9]._1_3_ =
                 (undefined3)((ulong)*(undefined8 *)(puVar5 + 8) >> 0x28);
            local_e8.data._M_elems._0_8_ = *(undefined8 *)puVar5;
            local_e8.data._M_elems._8_8_ = *(undefined8 *)(puVar5 + 2);
            local_e8.data._M_elems._16_8_ = *(undefined8 *)(puVar5 + 4);
            local_e8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar5 + 6),0);
            local_e8.data._M_elems[7]._1_3_ =
                 (undefined3)((ulong)*(undefined8 *)(puVar5 + 6) >> 0x28);
            local_e8.exp = puVar5[10];
            local_e8.neg = SUB41(puVar5[0xb],0);
            local_e8.fpclass = puVar5[0xc];
            local_e8.prec_elem = puVar5[0xd];
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_e8,&local_a8);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_68,&local_e8);
          lVar4 = *(long *)(this + 0x10);
          uVar9 = (ulong)(iVar8 - 1);
          iVar3 = *(int *)(lVar4 + -4 + (long)iVar8 * 4);
          piVar6 = (w->super_IdxSet).idx;
LAB_002f3bf6:
          iVar12 = (int)uVar13;
          uVar13 = (ulong)(iVar12 - 1);
          iVar12 = piVar6[(long)iVar12 + -1];
        }
        else {
          if (iVar3 <= iVar12) goto LAB_002f3bf6;
          uVar9 = (ulong)(iVar8 - 1);
          iVar3 = *(int *)(lVar4 + -4 + (long)iVar8 * 4);
        }
        uVar11 = (uint)uVar13;
        uVar7 = (uint)uVar9;
      } while ((uVar7 != 0) && (uVar11 != 0));
    }
    if ((uVar7 != 0) && (iVar3 != iVar12)) {
      lVar10 = (long)(int)uVar7;
      do {
        lVar10 = lVar10 + -1;
        iVar3 = *(int *)(lVar4 + lVar10 * 4);
        if (lVar10 == 0) break;
      } while (iVar3 != iVar12);
    }
    if ((uVar11 != 0) && (iVar3 != iVar12)) {
      lVar4 = (long)(int)uVar11;
      do {
        lVar4 = lVar4 + -1;
        iVar12 = piVar6[lVar4];
        if (lVar4 == 0) break;
      } while (iVar3 != iVar12);
    }
    if (iVar3 == iVar12) {
      lVar4 = (long)iVar3;
      puVar5 = (uint *)(*(long *)(this + 0x20) + lVar4 * 0x38);
      pnVar2 = (w->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 0x20);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar4].m_backend.data;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar2[lVar4].m_backend.data + 0x10);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.exp = pnVar2[lVar4].m_backend.exp;
      local_a8.neg = pnVar2[lVar4].m_backend.neg;
      local_a8.fpclass = pnVar2[lVar4].m_backend.fpclass;
      local_a8.prec_elem = pnVar2[lVar4].m_backend.prec_elem;
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems._24_5_ = 0;
      local_e8.data._M_elems[7]._1_3_ = 0;
      local_e8.data._M_elems._32_5_ = 0;
      local_e8.data._M_elems[9]._1_3_ = 0;
      local_e8.exp = 0;
      local_e8.neg = false;
      if (&local_e8 != (cpp_dec_float<50U,_int,_void> *)puVar5) {
        local_e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar5 + 8),0);
        local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)*(undefined8 *)(puVar5 + 8) >> 0x28);
        local_e8.data._M_elems._0_8_ = *(undefined8 *)puVar5;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)(puVar5 + 2);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)(puVar5 + 4);
        local_e8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar5 + 6),0);
        local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)*(undefined8 *)(puVar5 + 6) >> 0x28);
        local_e8.exp = puVar5[10];
        local_e8.neg = SUB41(puVar5[0xb],0);
        local_e8.fpclass = puVar5[0xc];
        local_e8.prec_elem = puVar5[0xd];
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_e8,&local_a8);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_68,&local_e8);
    }
  }
  *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       local_68.data._M_elems._16_8_;
  *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
       CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_68.data._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
       local_68.data._M_elems._8_8_;
  (__return_storage_ptr__->m_backend).exp = local_68.exp;
  (__return_storage_ptr__->m_backend).neg = local_68.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_68.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_68.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }